

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  byte *pbVar5;
  Ch *pCVar6;
  bool bVar7;
  bool bVar8;
  char *pcVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte bVar13;
  ulong i;
  ulong uVar14;
  SizeType SVar15;
  uint i_00;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  bool bVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  cVar2 = *is->src_;
  if (cVar2 == '\"') {
    ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler,false);
    return;
  }
  if (cVar2 == '[') {
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x329,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::StartArray(handler);
    if (bVar21) {
      SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*is->src_ == ']') {
        is->src_ = is->src_ + 1;
        bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndArray(handler,0);
        if (bVar21) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                        ,0x334,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
      else {
        SVar15 = 1;
        while( true ) {
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar4 = is->src_;
          if (*pcVar4 != ',') break;
          is->src_ = pcVar4 + 1;
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          SVar15 = SVar15 + 1;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*pcVar4 != ']') {
          lVar10 = (long)pcVar4 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 7;
          goto LAB_0013c87e;
        }
        is->src_ = pcVar4 + 1;
        bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndArray(handler,SVar15);
        if (bVar21) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                        ,0x346,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
    }
    else if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x32d,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar10 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0013c87e:
    *(long *)(this + 0x38) = lVar10;
    return;
  }
  if (cVar2 == 'f') {
    pcVar4 = is->src_;
    if (*pcVar4 != 'f') {
      __assert_fail("is.Peek() == \'f\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x373,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar9 = pcVar4 + 1;
    is->src_ = pcVar9;
    if (pcVar4[1] == 'a') {
      pcVar9 = pcVar4 + 2;
      is->src_ = pcVar9;
      if (pcVar4[2] == 'l') {
        pcVar9 = pcVar4 + 3;
        is->src_ = pcVar9;
        if (pcVar4[3] == 's') {
          pcVar9 = pcVar4 + 4;
          is->src_ = pcVar9;
          if (pcVar4[4] == 'e') {
            is->src_ = pcVar4 + 5;
            bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Bool(handler,false);
            if (bVar21) {
              return;
            }
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                            ,0x378,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            lVar10 = (long)is->src_ - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 0x10;
            goto LAB_0013c428;
          }
        }
      }
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x37b,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar10 = (long)pcVar9 - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 3;
LAB_0013c428:
    *(long *)(this + 0x38) = lVar10;
    return;
  }
  if (cVar2 == '{') {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x2e5,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::StartObject(handler);
    if (bVar21) {
      SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*is->src_ == '}') {
        is->src_ = is->src_ + 1;
        bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndObject(handler,0);
        if (bVar21) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                        ,0x2f0,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
      else {
        SVar15 = 1;
        while( true ) {
          if (*is->src_ != '\"') {
            lVar10 = (long)is->src_ - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 4;
            goto LAB_0013c6e5;
          }
          ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar4 = is->src_;
          if (*pcVar4 != ':') {
            lVar10 = (long)pcVar4 - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 5;
            goto LAB_0013c6e5;
          }
          is->src_ = pcVar4 + 1;
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar4 = is->src_;
          if (*pcVar4 != ',') break;
          is->src_ = pcVar4 + 1;
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          SVar15 = SVar15 + 1;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*pcVar4 != '}') {
          lVar10 = (long)pcVar4 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 6;
          goto LAB_0013c6e5;
        }
        is->src_ = pcVar4 + 1;
        bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndObject(handler,SVar15);
        if (bVar21) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                        ,0x315,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
    }
    else if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x2e9,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar10 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0013c6e5:
    *(long *)(this + 0x38) = lVar10;
    return;
  }
  if (cVar2 == 't') {
    pcVar4 = is->src_;
    if (*pcVar4 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x366,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar9 = pcVar4 + 1;
    is->src_ = pcVar9;
    if (pcVar4[1] == 'r') {
      pcVar9 = pcVar4 + 2;
      is->src_ = pcVar9;
      if (pcVar4[2] == 'u') {
        pcVar9 = pcVar4 + 3;
        is->src_ = pcVar9;
        if (pcVar4[3] == 'e') {
          is->src_ = pcVar4 + 4;
          bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Bool(handler,true);
          if (bVar21) {
            return;
          }
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                          ,0x36b,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          lVar10 = (long)is->src_ - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 0x10;
          goto LAB_0013c34c;
        }
      }
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x36e,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar10 = (long)pcVar9 - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 3;
LAB_0013c34c:
    *(long *)(this + 0x38) = lVar10;
    return;
  }
  if (cVar2 == 'n') {
    ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pbVar5 = (byte *)is->src_;
  bVar3 = *pbVar5;
  pbVar12 = pbVar5;
  bVar13 = bVar3;
  if (bVar3 == 0x2d) {
    pbVar12 = pbVar5 + 1;
    bVar13 = pbVar5[1];
  }
  pCVar6 = is->head_;
  if (bVar13 == 0x30) {
    uVar17 = (uint)pbVar12[1];
    pbVar11 = pbVar12 + 1;
    dVar22 = 0.0;
    bVar21 = false;
    i = 0;
    bVar8 = false;
    uVar14 = 0;
    bVar7 = false;
    i_00 = 0;
LAB_0013cb19:
    if ((char)uVar17 == '.') {
      uVar17 = (uint)pbVar11[1];
      pbVar12 = pbVar11 + 1;
      if ((byte)(pbVar11[1] - 0x3a) < 0xf6) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                        ,0x637,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xe;
        pbVar11 = pbVar12;
      }
      else {
        iVar19 = 0;
        pbVar11 = pbVar12;
        if (!bVar21) {
          if (!bVar7) {
            i = (ulong)i_00;
          }
          iVar19 = 0;
          while ((('/' < (char)(byte)uVar17 && ((byte)uVar17 < 0x3a)) && (i >> 0x35 == 0))) {
            pbVar11 = pbVar12 + 1;
            pbVar12 = pbVar12 + 1;
            iVar19 = iVar19 + -1;
            i = (ulong)(uVar17 - 0x30) + i * 10;
            uVar14 = (ulong)((int)uVar14 + (uint)(i != 0));
            uVar17 = (uint)*pbVar11;
          }
          auVar24._8_4_ = (int)(i >> 0x20);
          auVar24._0_8_ = i;
          auVar24._12_4_ = 0x45300000;
          dVar22 = (auVar24._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
          bVar8 = true;
          pbVar11 = pbVar12;
        }
        while ('/' < (char)(byte)uVar17) {
          if (0x39 < (byte)uVar17) goto LAB_0013cc60;
          if ((int)uVar14 < 0x11) {
            dVar22 = dVar22 * 10.0 + (double)(int)(uVar17 - 0x30);
            iVar19 = iVar19 + -1;
            if (0.0 < dVar22) {
              uVar14 = (ulong)((int)uVar14 + 1);
            }
          }
          uVar17 = (uint)pbVar11[1];
          pbVar11 = pbVar11 + 1;
        }
        iVar16 = 0;
LAB_0013cd8f:
        if (bVar8) {
          dVar22 = internal::StrtodNormalPrecision(dVar22,iVar16 + iVar19);
          if (1.79769313486232e+308 < dVar22) {
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                            ,0x6bb,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            goto LAB_0013cdb5;
          }
          if (bVar3 == 0x2d) {
            dVar22 = -dVar22;
          }
          bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Double(handler,dVar22);
        }
        else if (bVar7) {
          if (bVar3 == 0x2d) {
            bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Int64(handler,-i);
          }
          else {
            bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Uint64(handler,i);
          }
        }
        else if (bVar3 == 0x2d) {
          bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Int(handler,-i_00);
        }
        else {
          bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Uint(handler,i_00);
        }
        if (bVar21 != false) goto LAB_0013ce49;
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                        ,0x6d3,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0x10;
        pbVar12 = pbVar5;
      }
    }
    else {
      iVar19 = 0;
LAB_0013cc60:
      iVar16 = 0;
      if ((uVar17 | 0x20) != 0x65) goto LAB_0013cd8f;
      uVar14 = (ulong)i_00;
      if (bVar7) {
        uVar14 = i;
      }
      if (!bVar8) {
        auVar25._8_4_ = (int)(uVar14 >> 0x20);
        auVar25._0_8_ = uVar14;
        auVar25._12_4_ = 0x45300000;
        dVar22 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0);
        bVar8 = true;
      }
      bVar13 = pbVar11[1];
      bVar21 = bVar13 != 0x2b;
      if ((bVar21) && (bVar13 != 0x2d)) {
        pbVar12 = pbVar11 + 1;
        bVar21 = false;
      }
      else {
        bVar13 = pbVar11[2];
        pbVar12 = pbVar11 + 2;
      }
      if (9 < (byte)(bVar13 - 0x30)) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                        ,0x68c,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xf;
        pbVar11 = pbVar12;
        goto LAB_0013cdbf;
      }
      pbVar11 = pbVar12 + 1;
      iVar20 = bVar13 - 0x30;
      if (bVar21) {
        if (0 < iVar19) {
          __assert_fail("expFrac <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                        ,0x677,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        pbVar12 = pbVar11;
        while (pbVar11 = pbVar12, (byte)(*pbVar11 - 0x30) < 10) {
          iVar20 = iVar20 * 10 + (uint)*pbVar11 + -0x30;
          pbVar12 = pbVar11 + 1;
          if ((iVar19 + 0x7ffffff7) / 10 < iVar20) {
            do {
              pbVar1 = pbVar11 + 1;
              pbVar11 = pbVar11 + 1;
              pbVar12 = pbVar11;
            } while ((byte)(*pbVar1 - 0x30) < 10);
          }
        }
LAB_0013cd83:
        iVar16 = -iVar20;
        if (!bVar21) {
          iVar16 = iVar20;
        }
        goto LAB_0013cd8f;
      }
      do {
        bVar13 = *pbVar11;
        if (9 < (byte)(bVar13 - 0x30)) goto LAB_0013cd83;
        pbVar11 = pbVar11 + 1;
        iVar20 = iVar20 * 10 + (uint)bVar13 + -0x30;
      } while (iVar20 <= 0x134 - iVar19);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                      ,0x687,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
LAB_0013cdb5:
      *(undefined4 *)(this + 0x30) = 0xd;
      pbVar12 = pbVar5;
    }
  }
  else {
    if ((byte)(bVar13 - 0x31) < 9) {
      i_00 = bVar13 - 0x30;
      uVar14 = 0;
      if (bVar3 == 0x2d) {
LAB_0013c976:
        bVar13 = pbVar12[uVar14 + 1];
        uVar18 = (ulong)bVar13;
        if (9 < (byte)(bVar13 - 0x30)) goto LAB_0013ca4e;
        if (i_00 < 0xccccccc) {
LAB_0013c98f:
          i_00 = (i_00 * 10 + (uint)bVar13) - 0x30;
          uVar14 = uVar14 + 1;
          goto LAB_0013c976;
        }
        uVar17 = i_00;
        if (i_00 != 0xccccccc) goto LAB_0013c9f5;
        if (bVar13 < 0x39) goto LAB_0013c98f;
        uVar18 = 0x39;
        uVar17 = 0xccccccc;
LAB_0013c9f5:
        i_00 = uVar17;
        pbVar11 = pbVar12 + uVar14 + 1;
        i = (ulong)i_00;
        if (bVar3 == 0x2d) {
          while( true ) {
            uVar17 = (uint)uVar18;
            if (9 < (byte)((byte)uVar18 - 0x30)) break;
            if ((0xccccccccccccccb < i) && (0x38 < (byte)uVar18 || i != 0xccccccccccccccc))
            goto LAB_0013cab3;
            i = (uVar18 & 0xf) + i * 10;
            uVar14 = (ulong)((int)uVar14 + 1);
            uVar18 = (ulong)pbVar11[1];
            pbVar11 = pbVar11 + 1;
          }
        }
        else {
          while( true ) {
            uVar17 = (uint)uVar18;
            if (9 < (byte)((byte)uVar18 - 0x30)) break;
            if ((0x1999999999999998 < i) && (0x35 < (byte)uVar18 || i != 0x1999999999999999))
            goto LAB_0013cab3;
            i = (uVar18 & 0xf) + i * 10;
            uVar14 = (ulong)((int)uVar14 + 1);
            uVar18 = (ulong)pbVar11[1];
            pbVar11 = pbVar11 + 1;
          }
        }
        dVar22 = 0.0;
        bVar7 = true;
        bVar21 = false;
        bVar8 = false;
      }
      else {
        while( true ) {
          bVar13 = pbVar12[uVar14 + 1];
          uVar18 = (ulong)bVar13;
          if (9 < (byte)(bVar13 - 0x30)) break;
          if ((0x19999998 < i_00) &&
             ((uVar17 = i_00, i_00 != 0x19999999 || (uVar17 = 0x19999999, 0x35 < bVar13))))
          goto LAB_0013c9f5;
          i_00 = (i_00 * 10 + (uint)bVar13) - 0x30;
          uVar14 = uVar14 + 1;
        }
LAB_0013ca4e:
        uVar17 = (uint)bVar13;
        pbVar11 = pbVar12 + uVar14 + 1;
        dVar22 = 0.0;
        bVar21 = false;
        i = 0;
        bVar8 = false;
        bVar7 = false;
      }
      goto LAB_0013cb19;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/reader.h"
                    ,0x60c,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 3;
    pbVar11 = pbVar12;
  }
LAB_0013cdbf:
  *(long *)(this + 0x38) = (long)pbVar12 - (long)pCVar6;
LAB_0013ce49:
  is->src_ = (Ch *)pbVar11;
  is->head_ = pCVar6;
  return;
LAB_0013cab3:
  auVar23._8_4_ = (int)(i >> 0x20);
  auVar23._0_8_ = i;
  auVar23._12_4_ = 0x45300000;
  dVar22 = (auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  while (uVar17 = (uint)uVar18, (byte)((char)uVar18 - 0x30U) < 10) {
    dVar22 = dVar22 * 10.0 + (double)(int)(uVar17 - 0x30);
    pbVar12 = pbVar11 + 1;
    pbVar11 = pbVar11 + 1;
    uVar18 = (ulong)*pbVar12;
  }
  bVar21 = true;
  bVar8 = true;
  bVar7 = true;
  goto LAB_0013cb19;
}

Assistant:

Ch Peek() const { return *src_; }